

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFGdbIndex.cpp
# Opt level: O3

void __thiscall llvm::DWARFGdbIndex::dumpSymbolTable(DWARFGdbIndex *this,raw_ostream *OS)

{
  int *piVar1;
  uint uVar2;
  char *__n;
  int *piVar3;
  raw_ostream *this_00;
  ulong uVar4;
  ulong uVar5;
  void *__buf;
  int *piVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  int *piVar10;
  int iVar11;
  format_object_base local_50;
  undefined8 local_40;
  char *local_38;
  
  local_40 = (ulong)(this->SymbolTable).super_SmallVectorImpl<llvm::DWARFGdbIndex::SymTableEntry>.
                    super_SmallVectorTemplateBase<llvm::DWARFGdbIndex::SymTableEntry,_true>.
                    super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::SymTableEntry,_void>.
                    super_SmallVectorBase.Size;
  local_50.Fmt = "\n  Symbol table offset = 0x%x, size = %ld, filled slots:";
  local_50._vptr_format_object_base = (_func_int **)&PTR_home_01078068;
  local_38 = (char *)CONCAT44(local_38._4_4_,this->SymbolTableOffset);
  this_00 = raw_ostream::operator<<(OS,&local_50);
  __n = this_00->OutBufCur;
  if (__n < this_00->OutBufEnd) {
    this_00->OutBufCur = __n + 1;
    *__n = '\n';
  }
  else {
    raw_ostream::write(this_00,10,__buf,(size_t)__n);
  }
  uVar4 = (ulong)(this->SymbolTable).super_SmallVectorImpl<llvm::DWARFGdbIndex::SymTableEntry>.
                 super_SmallVectorTemplateBase<llvm::DWARFGdbIndex::SymTableEntry,_true>.
                 super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::SymTableEntry,_void>.
                 super_SmallVectorBase.Size;
  if (uVar4 != 0) {
    piVar10 = (int *)(this->SymbolTable).super_SmallVectorImpl<llvm::DWARFGdbIndex::SymTableEntry>.
                     super_SmallVectorTemplateBase<llvm::DWARFGdbIndex::SymTableEntry,_true>.
                     super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::SymTableEntry,_void>.
                     super_SmallVectorBase.BeginX;
    piVar1 = piVar10 + uVar4 * 2;
    iVar11 = -1;
    do {
      iVar11 = iVar11 + 1;
      local_40._4_4_ = *piVar10;
      local_40._0_4_ = piVar10[1];
      if (local_40._4_4_ != 0 || (int)local_40 != 0) {
        local_50.Fmt = "    %d: Name offset = 0x%x, CU vector offset = 0x%x\n";
        local_50._vptr_format_object_base = (_func_int **)&PTR_home_010784f0;
        local_38 = (char *)CONCAT44(local_38._4_4_,iVar11);
        raw_ostream::operator<<(OS,&local_50);
        uVar5 = (ulong)((this->ConstantPoolOffset - this->StringPoolOffset) + *piVar10);
        uVar4 = (this->ConstantPoolStrings).Length;
        if (uVar4 < uVar5) {
          uVar5 = uVar4;
        }
        piVar3 = (int *)(this->ConstantPoolVectors).
                        super_SmallVectorImpl<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>_>
                        .
                        super_SmallVectorTemplateBase<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_false>
                        .
                        super_SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
                        .super_SmallVectorBase.BeginX;
        uVar2 = (this->ConstantPoolVectors).
                super_SmallVectorImpl<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>_>
                .
                super_SmallVectorTemplateBase<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_false>
                .
                super_SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
                .super_SmallVectorBase.Size;
        uVar8 = (ulong)uVar2;
        piVar6 = piVar3;
        uVar4 = uVar8;
        if (3 < uVar8) {
          uVar4 = (ulong)(uVar2 >> 2);
          iVar7 = piVar10[1];
          lVar9 = uVar4 + 1;
          piVar6 = piVar3 + 0xc;
          do {
            if (piVar6[-0xc] == iVar7) {
              piVar6 = piVar6 + -0xc;
              goto LAB_00d74ff8;
            }
            if (piVar6[-6] == iVar7) {
              piVar6 = piVar6 + -6;
              goto LAB_00d74ff8;
            }
            if (*piVar6 == iVar7) goto LAB_00d74ff8;
            if (piVar6[6] == iVar7) {
              piVar6 = piVar6 + 6;
              goto LAB_00d74ff8;
            }
            lVar9 = lVar9 + -1;
            piVar6 = piVar6 + 0x18;
          } while (1 < lVar9);
          piVar6 = piVar3 + uVar4 * 0x18;
          uVar4 = ((long)(uVar8 * 0x18 + uVar4 * -0x60) >> 3) * -0x5555555555555555;
        }
        if (uVar4 == 3) {
          iVar7 = piVar10[1];
          if (*piVar6 != iVar7) {
            piVar6 = piVar6 + 6;
            goto LAB_00d74fd2;
          }
        }
        else {
          if (uVar4 == 2) {
            iVar7 = piVar10[1];
LAB_00d74fd2:
            if (*piVar6 == iVar7) goto LAB_00d74ff8;
            piVar6 = piVar6 + 6;
          }
          else {
            if (uVar4 != 1) goto LAB_00d75050;
            iVar7 = piVar10[1];
          }
          if (*piVar6 != iVar7) goto LAB_00d75050;
        }
LAB_00d74ff8:
        if (piVar6 == piVar3 + uVar8 * 6) {
LAB_00d75050:
          __assert_fail("CuVector != ConstantPoolVectors.end() && \"Invalid symbol table\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFGdbIndex.cpp"
                        ,0x4f,"void llvm::DWARFGdbIndex::dumpSymbolTable(raw_ostream &) const");
        }
        local_50.Fmt = "      String name: %s, CU vector index: %d\n";
        local_50._vptr_format_object_base = (_func_int **)&PTR_home_01078a00;
        local_40 = CONCAT44(local_40._4_4_,
                            (int)((ulong)((long)piVar6 - (long)piVar3) >> 3) * -0x55555555);
        local_38 = (this->ConstantPoolStrings).Data + uVar5;
        raw_ostream::operator<<(OS,&local_50);
      }
      piVar10 = piVar10 + 2;
    } while (piVar10 != piVar1);
  }
  return;
}

Assistant:

void DWARFGdbIndex::dumpSymbolTable(raw_ostream &OS) const {
  OS << format("\n  Symbol table offset = 0x%x, size = %" PRId64
               ", filled slots:",
               SymbolTableOffset, (uint64_t)SymbolTable.size())
     << '\n';
  uint32_t I = -1;
  for (const SymTableEntry &E : SymbolTable) {
    ++I;
    if (!E.NameOffset && !E.VecOffset)
      continue;

    OS << format("    %d: Name offset = 0x%x, CU vector offset = 0x%x\n", I,
                 E.NameOffset, E.VecOffset);

    StringRef Name = ConstantPoolStrings.substr(
        ConstantPoolOffset - StringPoolOffset + E.NameOffset);

    auto CuVector = std::find_if(
        ConstantPoolVectors.begin(), ConstantPoolVectors.end(),
        [&](const std::pair<uint32_t, SmallVector<uint32_t, 0>> &V) {
          return V.first == E.VecOffset;
        });
    assert(CuVector != ConstantPoolVectors.end() && "Invalid symbol table");
    uint32_t CuVectorId = CuVector - ConstantPoolVectors.begin();
    OS << format("      String name: %s, CU vector index: %d\n", Name.data(),
                 CuVectorId);
  }
}